

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O1

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true> __thiscall
duckdb::ChangeColumnTypeInfo::Deserialize(ChangeColumnTypeInfo *this,Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  ChangeColumnTypeInfo *this_00;
  pointer pCVar3;
  pointer *__ptr;
  byte bVar4;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var5;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var6;
  unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>,_true>
  result;
  _Head_base<0UL,_duckdb::ChangeColumnTypeInfo_*,_false> local_58;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_50;
  undefined8 local_48;
  undefined1 local_40;
  
  this_00 = (ChangeColumnTypeInfo *)operator_new(0xb8);
  ChangeColumnTypeInfo(this_00);
  local_58._M_head_impl = this_00;
  pCVar3 = unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>,_true>
           ::operator->((unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>,_true>
                         *)&local_58);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,400,"column_name");
  if ((char)uVar1 == '\0') {
    local_48._0_1_ = INVALID;
    local_48._1_1_ = INVALID;
    local_48._2_6_ = 0;
    local_40 = 0;
    local_50._M_head_impl = (ParsedExpression *)&local_40;
    ::std::__cxx11::string::operator=((string *)&pCVar3->column_name,(string *)&local_50);
    if (local_50._M_head_impl != (ParsedExpression *)&local_40) goto LAB_005d3232;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pCVar3->column_name,(string *)&local_50);
    if (local_50._M_head_impl != (ParsedExpression *)&local_40) {
LAB_005d3232:
      operator_delete(local_50._M_head_impl);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  pCVar3 = unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>,_true>
           ::operator->((unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>,_true>
                         *)&local_58);
  Deserializer::ReadProperty<duckdb::LogicalType>
            (deserializer,0x191,"target_type",&pCVar3->target_type);
  pCVar3 = unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>,_true>
           ::operator->((unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>,_true>
                         *)&local_58);
  iVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x192,"expression");
  bVar4 = (byte)iVar2;
  if (bVar4 == 0) {
    _Var5._M_head_impl =
         (pCVar3->expression).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pCVar3->expression).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    if (_Var5._M_head_impl == (ParsedExpression *)0x0) {
      bVar4 = 0;
      goto LAB_005d330d;
    }
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar2 == '\0') {
      _Var6._M_head_impl = (ParsedExpression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ParsedExpression::Deserialize((ParsedExpression *)&local_50,deserializer);
      _Var6._M_head_impl = local_50._M_head_impl;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var5._M_head_impl =
         (pCVar3->expression).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pCVar3->expression).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var6._M_head_impl;
    if (_Var5._M_head_impl == (ParsedExpression *)0x0) {
      bVar4 = 1;
      goto LAB_005d330d;
    }
  }
  (*((_Var5._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
LAB_005d330d:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar4);
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)this;
}

Assistant:

unique_ptr<AlterTableInfo> ChangeColumnTypeInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<ChangeColumnTypeInfo>(new ChangeColumnTypeInfo());
	deserializer.ReadPropertyWithDefault<string>(400, "column_name", result->column_name);
	deserializer.ReadProperty<LogicalType>(401, "target_type", result->target_type);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(402, "expression", result->expression);
	return std::move(result);
}